

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

uint8 * crnlib::image_utils::read_image_from_memory
                  (uint8 *pImage,int nSize,int *pWidth,int *pHeight,int *pActualComps,int req_comps,
                  char *pFilename)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint8 *__dest;
  uint8 *p;
  int iVar4;
  uint uVar5;
  color_quad<unsigned_char,_int> *color;
  uint uVar6;
  size_t __size;
  image_u8 luma_img;
  mipmapped_texture tex;
  buffer_stream buf_stream;
  image_u8 img;
  data_stream_serializer serializer;
  pixel_packer packer;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_178;
  image<crnlib::color_quad<unsigned_char,_int>_> local_168;
  mipmapped_texture local_130;
  buffer_stream local_e8;
  image_u8 local_b8;
  data_stream_serializer local_80;
  pixel_packer local_6c;
  
  __dest = (uint8 *)0x0;
  *pWidth = 0;
  *pHeight = 0;
  *pActualComps = 0;
  if (0xfffffffb < req_comps - 5U) {
    mipmapped_texture::mipmapped_texture(&local_130);
    buffer_stream::buffer_stream(&local_e8,pImage,nSize);
    dynamic_string::set(&local_e8.super_data_stream.m_name,pFilename,0xffffffff);
    local_80.m_little_endian = true;
    local_80.m_pStream = &local_e8.super_data_stream;
    bVar3 = mipmapped_texture::read_from_stream(&local_130,&local_80,cFormatInvalid);
    if ((!bVar3) ||
       ((bVar3 = mipmapped_texture::is_packed(&local_130), bVar3 &&
        (bVar3 = mipmapped_texture::unpack_from_dxt(&local_130,true), !bVar3)))) {
      __dest = (uint8 *)0x0;
    }
    else {
      local_b8.m_width = 0;
      local_b8.m_height = 0;
      local_b8.m_pitch = 0;
      local_b8.m_total = 0;
      local_b8.m_comp_flags = 0xf;
      local_b8.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
      local_b8.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
      local_b8.m_pixel_buf.m_size = 0;
      local_b8.m_pixel_buf.m_capacity = 0;
      local_178 = mipmapped_texture::get_level_image(&local_130,0,0,&local_b8,3);
      if (local_178 == (image_u8 *)0x0) {
        __dest = (uint8 *)0x0;
      }
      else {
        *pWidth = local_130.m_width;
        *pHeight = local_130.m_height;
        bVar3 = (local_178->m_comp_flags & 0x10) == 0;
        iVar4 = 4;
        if ((local_178->m_comp_flags & 8) == 0) {
          iVar4 = bVar3 + 1 + (uint)bVar3;
        }
        *pActualComps = iVar4;
        if (req_comps == 4) {
          __size = (ulong)(local_130.m_height * local_130.m_width) << 2;
          __dest = (uint8 *)malloc(__size);
          memcpy(__dest,local_178->m_pPixels,__size);
        }
        else {
          local_168.m_width = 0;
          local_168.m_height = 0;
          local_168.m_pitch = 0;
          local_168.m_total = 0;
          local_168.m_comp_flags = 0xf;
          local_168.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
          local_168.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
          local_168.m_pixel_buf.m_size = 0;
          local_168.m_pixel_buf.m_capacity = 0;
          if (req_comps == 1) {
            image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&local_168,local_178);
            image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(&local_168);
            local_178 = &local_168;
          }
          pixel_packer::init(&local_6c,(EVP_PKEY_CTX *)(ulong)(uint)req_comps);
          if (local_6c.m_pixel_stride == 0) {
            __dest = (uint8 *)0x0;
          }
          else {
            uVar1 = local_178->m_width;
            uVar2 = local_178->m_height;
            __dest = (uint8 *)crnlib_malloc((ulong)(local_6c.m_pixel_stride * uVar1 * uVar2));
            if (uVar2 != 0) {
              uVar6 = 0;
              p = __dest;
              do {
                if (uVar1 != 0) {
                  color = local_178->m_pPixels + local_178->m_pitch * uVar6;
                  uVar5 = uVar1;
                  do {
                    p = (uint8 *)pixel_packer::pack<crnlib::color_quad<unsigned_char,int>>
                                           (&local_6c,color,p,true);
                    uVar5 = uVar5 - 1;
                    color = color + 1;
                  } while (uVar5 != 0);
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar2);
            }
          }
          if (local_168.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(local_168.m_pixel_buf.m_p);
          }
        }
      }
      if (local_b8.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
        crnlib_free(local_b8.m_pixel_buf.m_p);
      }
    }
    data_stream::~data_stream(&local_e8.super_data_stream);
    mipmapped_texture::~mipmapped_texture(&local_130);
  }
  return __dest;
}

Assistant:

uint8* read_image_from_memory(const uint8* pImage, int nSize, int* pWidth, int* pHeight, int* pActualComps, int req_comps, const char* pFilename) {
  *pWidth = 0;
  *pHeight = 0;
  *pActualComps = 0;

  if ((req_comps < 1) || (req_comps > 4))
    return NULL;

  mipmapped_texture tex;

  buffer_stream buf_stream(pImage, nSize);
  buf_stream.set_name(pFilename);
  data_stream_serializer serializer(buf_stream);

  if (!tex.read_from_stream(serializer))
    return NULL;

  if (tex.is_packed()) {
    if (!tex.unpack_from_dxt(true))
      return NULL;
  }

  image_u8 img;
  image_u8* pImg = tex.get_level_image(0, 0, img);
  if (!pImg)
    return NULL;

  *pWidth = tex.get_width();
  *pHeight = tex.get_height();

  if (pImg->has_alpha())
    *pActualComps = 4;
  else if (pImg->is_grayscale())
    *pActualComps = 1;
  else
    *pActualComps = 3;

  uint8* pDst = NULL;
  if (req_comps == 4) {
    pDst = (uint8*)malloc(tex.get_total_pixels() * sizeof(uint32));
    uint8* pSrc = (uint8*)pImg->get_ptr();
    memcpy(pDst, pSrc, tex.get_total_pixels() * sizeof(uint32));
  } else {
    image_u8 luma_img;
    if (req_comps == 1) {
      luma_img = *pImg;
      luma_img.convert_to_grayscale();
      pImg = &luma_img;
    }

    pixel_packer packer(req_comps, 8);
    uint32 n;
    pDst = image_utils::pack_image(*pImg, packer, n);
  }

  return pDst;
}